

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_form_insert2
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_ADJ_ITEM pRVar6;
  REF_INT *pRVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  bool bVar14;
  REF_INT seg_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  int local_54;
  int local_50;
  REF_INT local_4c;
  long local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar1 = ref_node->ref_mpi->id;
  if ((iVar1 == ref_node->part[node]) && (iVar1 == ref_node->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      if (-1 < site) {
        ref_cell = ref_grid->cell[3];
        pRVar3 = ref_cell->ref_adj;
        if ((site < pRVar3->nnode) && (lVar10 = (long)pRVar3->first[site], lVar10 != -1)) {
          pRVar6 = pRVar3->item;
          do {
            iVar1 = pRVar6[lVar10].ref;
            iVar2 = ref_cell->node_per;
            if (iVar2 < 1) {
LAB_00197c34:
              if ((faceid == -1) || (ref_cell->c2n[ref_cell->size_per * iVar1 + iVar2] == faceid)) {
                local_48 = (long)iVar1;
                local_38 = lVar10;
                uVar5 = ref_list_contains(ref_cavity->tri_list,iVar1,&local_3c);
                if (uVar5 != 0) {
                  pcVar13 = "have tri?";
                  uVar9 = 0x45e;
                  goto LAB_00197e8d;
                }
                if (local_3c != 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x45f,"ref_cavity_form_insert2","added tri twice?");
                  return 1;
                }
                uVar5 = ref_list_push(ref_cavity->tri_list,(REF_INT)local_48);
                if (uVar5 != 0) {
                  pcVar13 = "save tri";
                  uVar9 = 0x460;
                  goto LAB_00197e8d;
                }
                uVar5 = ref_cell_all_local(ref_cell,ref_node,(REF_INT)local_48,&local_40);
                if (uVar5 != 0) {
                  pcVar13 = "local cell";
                  uVar9 = 0x461;
                  goto LAB_00197e8d;
                }
                if (local_40 == 0) goto LAB_00197e2c;
                pRVar7 = ref_cell->c2n;
                lVar10 = ref_cell->size_per * local_48;
                local_4c = pRVar7[(long)(int)lVar10 + (long)ref_cell->node_per];
                local_54 = pRVar7[lVar10 + 1];
                local_50 = pRVar7[lVar10 + 2];
                if (local_50 != node && local_54 != node) {
                  uVar5 = ref_cavity_insert_seg(ref_cavity,&local_54);
                  if (uVar5 != 0) {
                    pcVar13 = "tri side";
                    uVar9 = 0x46c;
                    goto LAB_00197e8d;
                  }
                  pRVar7 = ref_cell->c2n;
                  lVar10 = ref_cell->size_per * local_48;
                }
                local_54 = pRVar7[lVar10 + 2];
                local_50 = pRVar7[lVar10];
                if (local_50 != node && local_54 != node) {
                  uVar5 = ref_cavity_insert_seg(ref_cavity,&local_54);
                  if (uVar5 != 0) {
                    pcVar13 = "tri side";
                    uVar9 = 0x472;
                    goto LAB_00197e8d;
                  }
                  pRVar7 = ref_cell->c2n;
                  lVar10 = ref_cell->size_per * local_48;
                }
                local_54 = pRVar7[lVar10];
                local_50 = pRVar7[lVar10 + 1];
                lVar10 = local_38;
                if ((local_50 != node && local_54 != node) &&
                   (uVar5 = ref_cavity_insert_seg(ref_cavity,&local_54), lVar10 = local_38,
                   uVar5 != 0)) {
                  pcVar13 = "tri side";
                  uVar9 = 0x478;
                  goto LAB_00197e8d;
                }
              }
            }
            else {
              iVar8 = 0;
              bVar14 = false;
              do {
                while (!bVar14) {
                  iVar11 = ref_cell->size_per * iVar1 + iVar8;
                  bVar14 = ref_cell->c2n[iVar11] == protect;
                  iVar8 = iVar8 + 1;
                  if (iVar8 == iVar2) {
                    if (ref_cell->c2n[iVar11] != protect) goto LAB_00197c34;
                    goto LAB_00197dab;
                  }
                }
                iVar8 = iVar8 + 1;
                bVar14 = true;
              } while (iVar8 != iVar2);
            }
LAB_00197dab:
            pRVar6 = ref_cell->ref_adj->item;
            lVar10 = (long)pRVar6[(int)lVar10].next;
          } while (lVar10 != -1);
        }
      }
      if ((ref_cavity->debug != 0) &&
         (ref_cavity_tec(ref_cavity,"form-tri.tec"), ref_cavity->debug != 0)) {
        printf("insert form tri state %d\n",(ulong)ref_cavity->state);
      }
      RVar4 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar4 == 0) {
        if (ref_cavity->debug != 0) {
          printf("insert tri manifold state %d\n",(ulong)ref_cavity->state);
        }
        uVar5 = ref_cavity_enlarge_conforming(ref_cavity);
        if (uVar5 == 0) {
          if (ref_cavity->state != REF_CAVITY_VISIBLE) {
            return 1;
          }
          ref_cavity->state = REF_CAVITY_UNKNOWN;
          if (ref_cavity->debug != 0) {
            printf("insert tri conforming state %d\n",0);
          }
          uVar5 = ref_cavity_form_insert2_tet(ref_cavity,faceid);
          if (uVar5 == 0) {
            return 0;
          }
          pcVar13 = "form tet ball";
          uVar9 = 0x48c;
        }
        else {
          pcVar13 = "enlarge boundary";
          uVar9 = 0x484;
        }
LAB_00197e8d:
        uVar12 = (ulong)uVar5;
      }
      else {
        pcVar13 = "ball seg manifold";
        uVar5 = 1;
        uVar9 = 0x480;
        uVar12 = 1;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar9,"ref_cavity_form_insert2",uVar12,pcVar13);
      return uVar5;
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
LAB_00197e2c:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2(REF_CAVITY ref_cavity,
                                           REF_GRID ref_grid, REF_INT node,
                                           REF_INT site, REF_INT protect,
                                           REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_BOOL already_have_it, all_local, has_node;
  REF_INT seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tri?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tri.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert form tri state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert tri manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  if (ref_cavity_debug(ref_cavity))
    printf("insert tri conforming state %d\n",
           (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}